

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

void __thiscall
FxLoopStatement::Backpatch
          (FxLoopStatement *this,VMFunctionBuilder *build,size_t loopstart,size_t loopend)

{
  uint uVar1;
  FxJumpStatement **ppFVar2;
  uint local_2c;
  uint i;
  size_t loopend_local;
  size_t loopstart_local;
  VMFunctionBuilder *build_local;
  FxLoopStatement *this_local;
  
  local_2c = 0;
  while( true ) {
    uVar1 = TArray<FxJumpStatement_*,_FxJumpStatement_*>::Size(&this->Jumps);
    if (uVar1 <= local_2c) break;
    ppFVar2 = TArray<FxJumpStatement_*,_FxJumpStatement_*>::operator[](&this->Jumps,(ulong)local_2c)
    ;
    if ((*ppFVar2)->Token == 0x126) {
      ppFVar2 = TArray<FxJumpStatement_*,_FxJumpStatement_*>::operator[]
                          (&this->Jumps,(ulong)local_2c);
      VMFunctionBuilder::Backpatch(build,(*ppFVar2)->Address,loopend);
    }
    else {
      ppFVar2 = TArray<FxJumpStatement_*,_FxJumpStatement_*>::operator[]
                          (&this->Jumps,(ulong)local_2c);
      VMFunctionBuilder::Backpatch(build,(*ppFVar2)->Address,loopstart);
    }
    local_2c = local_2c + 1;
  }
  return;
}

Assistant:

void FxLoopStatement::Backpatch(VMFunctionBuilder *build, size_t loopstart, size_t loopend)
{
	// Give a proper address to any break/continue statement within this loop.
	for (unsigned int i = 0; i < Jumps.Size(); i++)
	{
		if (Jumps[i]->Token == TK_Break)
		{
			build->Backpatch(Jumps[i]->Address, loopend);
		}
		else
		{ // Continue statement.
			build->Backpatch(Jumps[i]->Address, loopstart);
		}
	}
}